

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O2

bool __thiscall despot::Variable::HasValue(Variable *this,string *value)

{
  pointer pbVar1;
  __type_conflict _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = 0xffffffffffffffff;
  lVar3 = 0;
  do {
    pbVar1 = (this->values_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = (long)(this->values_).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5;
    uVar5 = uVar5 + 1;
    if (uVar4 <= uVar5) break;
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((long)&(pbVar1->_M_dataplus)._M_p + lVar3);
    lVar3 = lVar3 + 0x20;
    _Var2 = std::operator==(__lhs,value);
  } while (!_Var2);
  return uVar5 < uVar4;
}

Assistant:

const bool Variable::HasValue(string value) const {
	for (int i = 0; i < values_.size(); i++)
		if (values_[i] == value)
			return true;
	return false;
}